

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

UniquePtr<SSL_CREDENTIAL>
ssl_credential_new_spake2plusv1
          (SSLCredentialType type,Span<const_unsigned_char> context,
          Span<const_unsigned_char> client_identity,Span<const_unsigned_char> server_identity,
          uint32_t limit)

{
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  bool bVar1;
  pointer psVar2;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true> this;
  undefined4 in_register_0000008c;
  __int_type in_stack_00000018;
  unique_ptr<ssl_credential_st,_bssl::internal::Deleter> local_58;
  UniquePtr<ssl_credential_st> cred;
  SSLCredentialType type_local;
  Span<const_unsigned_char> client_identity_local;
  Span<const_unsigned_char> context_local;
  memory_order __b;
  
  this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._0_4_ = type;
  in.size_._4_4_ = in_register_0000008c;
  in.size_._0_4_ = limit;
  cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ = (int)context.data_;
  if (cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ != 2 &&
      cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl._4_4_ != 3) {
    __assert_fail("type == SSLCredentialType::kSPAKE2PlusV1Client || type == SSLCredentialType::kSPAKE2PlusV1Server"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,499,
                  "UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(SSLCredentialType, Span<const uint8_t>, Span<const uint8_t>, Span<const uint8_t>, uint32_t)"
                 );
  }
  bssl::MakeUnique<ssl_credential_st,bssl::SSLCredentialType&>
            ((bssl *)&local_58,
             (SSLCredentialType *)
             ((long)&cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl + 4));
  bVar1 = std::operator==(&local_58,(nullptr_t)0x0);
  if (bVar1) {
    std::unique_ptr<ssl_credential_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_credential_st,bssl::internal::Deleter> *)
               this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  else {
    psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&local_58);
    in_00.size_ = (size_t)client_identity.data_;
    in_00.data_ = (uchar *)context.size_;
    bVar1 = bssl::Array<unsigned_char>::CopyFrom(&psVar2->pake_context,in_00);
    if (bVar1) {
      psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&local_58);
      in.data_ = (uchar *)client_identity.size_;
      bVar1 = bssl::Array<unsigned_char>::CopyFrom(&psVar2->client_identity,in);
      if (bVar1) {
        psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&local_58);
        bVar1 = bssl::Array<unsigned_char>::CopyFrom(&psVar2->server_identity,server_identity);
        if (bVar1) {
          psVar2 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                             (&local_58);
          std::operator&(memory_order_seq_cst,__memory_order_mask);
          LOCK();
          (psVar2->pake_limit).super___atomic_base<unsigned_int>._M_i = in_stack_00000018;
          UNLOCK();
          std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::unique_ptr
                    ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)
                     this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,&local_58);
          goto LAB_001a4c4a;
        }
      }
    }
    std::unique_ptr<ssl_credential_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<ssl_credential_st,bssl::internal::Deleter> *)
               this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
LAB_001a4c4a:
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  return (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<ssl_credential_st_*,_bssl::internal::Deleter>)
         this.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
}

Assistant:

static UniquePtr<SSL_CREDENTIAL> ssl_credential_new_spake2plusv1(
    SSLCredentialType type, Span<const uint8_t> context,
    Span<const uint8_t> client_identity, Span<const uint8_t> server_identity,
    uint32_t limit) {
  assert(type == SSLCredentialType::kSPAKE2PlusV1Client ||
         type == SSLCredentialType::kSPAKE2PlusV1Server);
  auto cred = MakeUnique<SSL_CREDENTIAL>(type);
  if (cred == nullptr) {
    return nullptr;
  }

  if (!cred->pake_context.CopyFrom(context) ||
      !cred->client_identity.CopyFrom(client_identity) ||
      !cred->server_identity.CopyFrom(server_identity)) {
    return nullptr;
  }

  cred->pake_limit.store(limit);
  return cred;
}